

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int int32_decode(cram_fd *fd,int32_t *val)

{
  int iVar1;
  ssize_t sVar2;
  int32_t i;
  
  sVar2 = hread(fd->fp,&i,4);
  if (sVar2 == 4) {
    *val = i;
    iVar1 = 4;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int int32_decode(cram_fd *fd, int32_t *val) {
    int32_t i;
    if (4 != hread(fd->fp, &i, 4))
	return -1;

    *val = le_int4(i);
    return 4;
}